

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<Assimp::FILongValue> __thiscall
Assimp::FILongValue::create(FILongValue *this,vector<long,_std::allocator<long>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FILongValue> sVar1;
  vector<long,_std::allocator<long>_> local_28;
  vector<long,_std::allocator<long>_> *value_local;
  
  local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)value;
  value_local = (vector<long,_std::allocator<long>_> *)this;
  std::make_shared<Assimp::FILongValueImpl,std::vector<long,std::allocator<long>>>(&local_28);
  std::shared_ptr<Assimp::FILongValue>::shared_ptr<Assimp::FILongValueImpl,void>
            ((shared_ptr<Assimp::FILongValue> *)this,
             (shared_ptr<Assimp::FILongValueImpl> *)&local_28);
  std::shared_ptr<Assimp::FILongValueImpl>::~shared_ptr
            ((shared_ptr<Assimp::FILongValueImpl> *)&local_28);
  sVar1.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FILongValue>)
         sVar1.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FILongValue> FILongValue::create(std::vector<int64_t> &&value) {
    return std::make_shared<FILongValueImpl>(std::move(value));
}